

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O2

void __thiscall App::draw(App *this,Graphics *g)

{
  Character *this_00;
  Brick *pBVar1;
  pointer pFVar2;
  pointer pBVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  iterator __position;
  Rng *pRVar8;
  iterator __position_00;
  Brick *brick;
  Brick *this_01;
  char *pcVar9;
  byte bVar10;
  Firework *firework_1;
  pointer this_02;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float fVar11;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float y;
  float fVar12;
  float extraout_XMM0_Da_03;
  vec2 center;
  vec2 position;
  float y_00;
  vec4 color;
  vec4 color_00;
  vec4 color_01;
  allocator local_161;
  vector<Brick,_std::allocator<Brick>_> *local_160;
  Graphics *local_158;
  int *local_150;
  Enemy enemy;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->state != STARTSCREEN) && (this->state != VICTORY)) {
    iVar5 = piksel::BaseApp::millis(&this->super_BaseApp);
    iVar5 = piksel::Timer::getElapsedTimeInMillis(&this->enemySpawnTimer,iVar5);
    if (this->enemySpawnDelayInMillis < iVar5) {
      iVar5 = piksel::BaseApp::millis(&this->super_BaseApp);
      piksel::Timer::reset(&this->enemySpawnTimer,iVar5);
      if (this->enemySpawnPointToggle == true) {
        Enemy::Enemy(&enemy,(vec2)0x4324000041000000,(vec2)0x4100000041000000,(vec2)0x3f800000);
        Enemy::setup(&enemy,&this->spritesheet);
        std::vector<Enemy,_std::allocator<Enemy>_>::push_back(&this->enemies,&enemy);
      }
      else {
        center.field_0.field_0.y = 164.0;
        center.field_0.field_0.x = (float)(this->super_BaseApp).width + -8.0;
        Enemy::Enemy(&enemy,center,(vec2)0x4100000041000000,(vec2)0x80000000bf800000);
        Enemy::setup(&enemy,&this->spritesheet);
        std::vector<Enemy,_std::allocator<Enemy>_>::push_back(&this->enemies,&enemy);
      }
      Enemy::~Enemy(&enemy);
      this->enemySpawnPointToggle = (bool)(this->enemySpawnPointToggle ^ 1);
    }
  }
  piksel::Graphics::background(g,(vec4)(ZEXT816(0x3f80000000000000) << 0x40));
  piksel::Graphics::noStroke(g);
  local_158 = g;
  if ((this->state & ~GAME) != GAMEOVER) {
    pBVar1 = (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
                   super__Vector_impl_data._M_start; this_01 != pBVar1; this_01 = this_01 + 1) {
      Brick::draw(this_01,g);
    }
    Paddle::update(&this->paddle,0x20,(int)((float)(this->super_BaseApp).width + -32.0),
                   (vec2)(this->mousePos).field_0.field_0);
    Paddle::draw(&this->paddle,g);
    if (this->state == STARTSCREEN) goto LAB_00133497;
  }
  __position._M_current =
       (this->enemies).super__Vector_base<Enemy,_std::allocator<Enemy>_>._M_impl.
       super__Vector_impl_data._M_start;
  while (g = local_158,
        __position._M_current !=
        (this->enemies).super__Vector_base<Enemy,_std::allocator<Enemy>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    iVar5 = (this->super_BaseApp).width;
    iVar6 = piksel::BaseApp::millis(&this->super_BaseApp);
    Enemy::update(__position._M_current,iVar5,&this->paddle,&this->bricks,&this->character,iVar6,
                  (this->state & ~GAME) == GAMEOVER);
    iVar5 = Enemy::getTimeOfDeathInMillis(__position._M_current);
    if (iVar5 < 0) {
LAB_00133355:
      bVar4 = Enemy::isOutOfBounds
                        (__position._M_current,0,(this->super_BaseApp).width,0x40,
                         (this->super_BaseApp).height);
      if (bVar4) goto LAB_0013336e;
      Enemy::draw(__position._M_current,local_158);
      __position._M_current = __position._M_current + 1;
    }
    else {
      iVar5 = piksel::BaseApp::millis(&this->super_BaseApp);
      iVar6 = Enemy::getTimeOfDeathInMillis(__position._M_current);
      if (iVar5 - iVar6 < 0xbb9) goto LAB_00133355;
LAB_0013336e:
      __position = std::vector<Enemy,_std::allocator<Enemy>_>::erase
                             (&this->enemies,__position._M_current);
    }
  }
  if (this->state == VICTORY) {
    piksel::Graphics::push(local_158);
    pRVar8 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar8);
    if (extraout_XMM0_Da < 0.1) {
      pRVar8 = piksel::Rng::getInstance();
      piksel::Rng::random(pRVar8);
      position.field_0.field_0.y = (float)(this->super_BaseApp).height;
      position.field_0.field_0.x = (float)extraout_XMM0_Da_00;
      Firework::Firework((Firework *)&enemy,position);
      std::vector<Firework,_std::allocator<Firework>_>::push_back
                (&this->fireworks,(value_type *)&enemy);
      std::_Vector_base<Particle,_std::allocator<Particle>_>::~_Vector_base
                ((_Vector_base<Particle,_std::allocator<Particle>_> *)(enemy.animations + 1));
    }
    pFVar2 = (this->fireworks).super__Vector_base<Firework,_std::allocator<Firework>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_02 = (this->fireworks).super__Vector_base<Firework,_std::allocator<Firework>_>._M_impl
                   .super__Vector_impl_data._M_start; this_02 != pFVar2; this_02 = this_02 + 1) {
      Firework::applyForce(this_02,(vec2)0x3e4ccccd00000000);
      Firework::update(this_02);
      Firework::draw(this_02,g);
    }
    __position_00._M_current =
         (this->fireworks).super__Vector_base<Firework,_std::allocator<Firework>_>._M_impl.
         super__Vector_impl_data._M_start;
    while (__position_00._M_current !=
           (this->fireworks).super__Vector_base<Firework,_std::allocator<Firework>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      bVar4 = Firework::isDone(__position_00._M_current);
      if (bVar4) {
        __position_00 =
             std::vector<Firework,_std::allocator<Firework>_>::erase
                       (&this->fireworks,__position_00._M_current);
      }
      else {
        __position_00._M_current = __position_00._M_current + 1;
      }
    }
    piksel::Graphics::pop(g);
  }
LAB_00133497:
  drawBoundaries(this,g);
  iVar5 = (this->super_BaseApp).width;
  this_00 = &this->character;
  iVar6 = (this->super_BaseApp).height;
  iVar7 = piksel::BaseApp::millis(&this->super_BaseApp);
  Character::update(this_00,0x20,(int)((float)iVar5 + -32.0),0x40,iVar6,&this->paddle,&this->bricks,
                    iVar7,(this->super_BaseApp).width / 2,(this->state & ~GAME) == GAMEOVER);
  Character::draw(this_00,g);
  if (this->state == GAME) {
    iVar5 = (this->super_BaseApp).width;
    iVar6 = (this->super_BaseApp).height;
    local_150 = &this->enemySpawnDelayInMillis;
    local_160 = &this->bricks;
    iVar7 = piksel::BaseApp::millis(&this->super_BaseApp);
    g = local_158;
    Ball::update(&this->ball,0x20,(int)((float)iVar5 + -32.0),0x40,iVar6,&this->paddle,local_160,
                 local_150,iVar5,iVar6,iVar7);
    Ball::draw(&this->ball,g);
  }
  drawScores(this,g);
  iVar5 = Character::getLives(this_00);
  if ((iVar5 < 1) || (iVar5 = Ball::getLives(&this->ball), iVar5 < 1)) {
    this->state = GAMEOVER;
    pBVar3 = (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
        super__Vector_impl_data._M_finish != pBVar3) {
      (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
      super__Vector_impl_data._M_finish = pBVar3;
    }
  }
  else if ((this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (this->bricks).super__Vector_base<Brick,_std::allocator<Brick>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    this->state = VICTORY;
  }
  else {
    if (VICTORY < this->state) {
      return;
    }
    if (this->state == GAME) {
      return;
    }
  }
  piksel::Graphics::push(g);
  piksel::Graphics::textSize(g,42.0);
  if (this->state == STARTSCREEN) {
    fVar11 = 66.0;
  }
  else {
    fVar11 = *(float *)(&DAT_0016e1dc + (ulong)(this->state == GAMEOVER) * 4);
  }
  iVar5 = (this->super_BaseApp).height;
  iVar6 = piksel::BaseApp::millis(&this->super_BaseApp);
  iVar6 = piksel::Timer::getElapsedTimeInMillis(&this->glitchTimer,iVar6);
  bVar10 = this->glitch;
  if (this->glitchDuration < iVar6) {
    pRVar8 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar8);
    this->glitchDuration = (int)extraout_XMM0_Da_01;
    iVar6 = piksel::BaseApp::millis(&this->super_BaseApp);
    piksel::Timer::reset(&this->glitchTimer,iVar6);
    bVar10 = this->glitch ^ 1;
    this->glitch = (bool)bVar10;
  }
  if ((bVar10 & 1) != 0) {
    pRVar8 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar8);
    local_160 = (vector<Brick,_std::allocator<Brick>_> *)
                CONCAT44(local_160._4_4_,extraout_XMM0_Da_02);
    pRVar8 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar8);
    piksel::Graphics::scale(g,local_160._0_4_,y);
    bVar10 = this->glitch;
  }
  y_00 = (float)(iVar5 / 2 + -0xc);
  fVar12 = 0.0;
  if ((bVar10 & 1) != 0) {
    local_160 = (vector<Brick,_std::allocator<Brick>_> *)CONCAT44(local_160._4_4_,y_00);
    pRVar8 = piksel::Rng::getInstance();
    piksel::Rng::random(pRVar8);
    y_00 = local_160._0_4_;
    fVar12 = extraout_XMM0_Da_03;
  }
  piksel::Graphics::translate(g,fVar11 + fVar12,y_00);
  enemy.super_AABB.center.field_0 =
       (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)enemy.animations;
  enemy.super_AABB.halfDimension.field_0 =
       (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)
       (anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
        )0x0;
  enemy.animations[0].frames.super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  std::__cxx11::string::assign((char *)&enemy);
  piksel::Graphics::fill(g,(vec4)(ZEXT816(0x3f80000000000000) << 0x40));
  std::__cxx11::string::string((string *)&local_50,(string *)&enemy);
  piksel::Graphics::text(g,&local_50,0.0,3.0);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->glitch == true) {
    color.field_0._8_8_ = 0x3f0000003f800000;
    color.field_0._0_8_ = 0x3f800000;
    piksel::Graphics::fill(g,color);
    std::__cxx11::string::string((string *)&local_70,(string *)&enemy);
    piksel::Graphics::text(g,&local_70,-3.0,0.0);
    std::__cxx11::string::~string((string *)&local_70);
    color_00.field_0._8_8_ = 0x3f0000003f800000;
    color_00.field_0._0_8_ = 0x3f80000000000000;
    piksel::Graphics::fill(g,color_00);
    std::__cxx11::string::string((string *)&local_90,(string *)&enemy);
    piksel::Graphics::text(g,&local_90,3.0,0.0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  color_01.field_0._8_8_ = 0x3f8000003f800000;
  color_01.field_0._0_8_ = 0x3f8000003f800000;
  piksel::Graphics::fill(g,color_01);
  std::__cxx11::string::string((string *)&local_b0,(string *)&enemy);
  piksel::Graphics::text(g,&local_b0,0.0,0.0);
  std::__cxx11::string::~string((string *)&local_b0);
  piksel::Graphics::pop(g);
  iVar5 = piksel::Graphics::millis(g);
  if (((long)iVar5 / 1000 & 1U) == 0) {
    pcVar9 = "PRESS ENTER TO RESTART";
    if (this->state == STARTSCREEN) {
      pcVar9 = "PRESS ENTER TO START";
    }
    std::__cxx11::string::string((string *)&local_d0,pcVar9,&local_161);
    iVar5 = (this->super_BaseApp).width / 2;
    iVar6 = iVar5 + -0x5f;
    if (this->state != STARTSCREEN) {
      iVar6 = iVar5 + -0x69;
    }
    piksel::Graphics::text
              (g,&local_d0,(float)iVar6,(float)((this->super_BaseApp).height / 2 + 0x2a));
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&enemy);
  return;
}

Assistant:

void App::draw(piksel::Graphics& g) {
    if (state != STARTSCREEN && state != VICTORY) {
        if (enemySpawnTimer.getElapsedTimeInMillis(millis()) > enemySpawnDelayInMillis) {
            enemySpawnTimer.reset(millis());
            if (enemySpawnPointToggle) {
                Enemy enemy(glm::vec2(ENEMY_WIDTH / 2.0f, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - ENEMY_HEIGHT / 2.0f), glm::vec2(ENEMY_WIDTH / 2.0f, ENEMY_HEIGHT / 2.0f), ENEMY_BASE_VELOCITY);
                enemy.setup(spritesheet);
                enemies.push_back(enemy);
            } else {
                Enemy enemy(glm::vec2(width - ENEMY_WIDTH / 2.0f, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - ENEMY_HEIGHT / 2.0f), glm::vec2(ENEMY_WIDTH / 2.0f, ENEMY_HEIGHT / 2.0f), -ENEMY_BASE_VELOCITY);
                enemy.setup(spritesheet);
                enemies.push_back(enemy);
            }
            enemySpawnPointToggle = !enemySpawnPointToggle;
        }
    }
    g.background(BLACK);
    g.noStroke();
    if (state != GAMEOVER && state != VICTORY) {
        for (Brick& brick : bricks) {
            brick.draw(g);
        }
        paddle.update(BRICK_WIDTH, width - BRICK_WIDTH, mousePos);
        paddle.draw(g);
    }
    if (state != STARTSCREEN) {
        std::vector<Enemy>::iterator it = enemies.begin();
        while (it != enemies.end()) {
            Enemy& enemy = *it;
            enemy.update(width, paddle, bricks, character, millis(), state == VICTORY || state == GAMEOVER);
            if ((enemy.getTimeOfDeathInMillis() > -1 && millis() - enemy.getTimeOfDeathInMillis() > 3000)
                || enemy.isOutOfBounds(0, width, BRICK_WIDTH + BRICK_WIDTH, height)) {
                it = enemies.erase(it);
            } else {
                enemy.draw(g);
                it++;
            }
        }
    }
    if (state == VICTORY) {
        g.push();
        if (piksel::Rng::getInstance().random(0, 1) < 0.1f) {
            Firework firework(glm::vec2(piksel::Rng::getInstance().random(0, width), height));
            fireworks.push_back(firework);
        }
        for (Firework& firework : fireworks) {
            firework.applyForce(GRAVITY);
            firework.update();
            firework.draw(g);
        }
        std::vector<Firework>::iterator it = fireworks.begin();
        while (it != fireworks.end()) {
            if ((*it).isDone()) {
                it = fireworks.erase(it);
            } else {
                it++;
            }
        }
        g.pop();
    }
    drawBoundaries(g);
    character.update(BRICK_WIDTH, width - BRICK_WIDTH, BRICK_WIDTH + BRICK_WIDTH, height, paddle, bricks, millis(), width / 2, state == VICTORY || state == GAMEOVER);
    character.draw(g);
    if (state == GAME) {
        ball.update(BRICK_WIDTH, width - BRICK_WIDTH, BRICK_WIDTH + BRICK_WIDTH, height, paddle, bricks, enemySpawnDelayInMillis, width, height, millis());
        ball.draw(g);
    }
    drawScores(g);
    if (character.getLives() <= 0 || ball.getLives() <= 0) {
        state = GAMEOVER;
        bricks.clear();
    } else if (bricks.empty()) {
        state = VICTORY;
    }
    if (state == STARTSCREEN || state == GAMEOVER || state == VICTORY) {
        g.push();

        g.textSize(42);
        float hw;
        switch (state) {
            case STARTSCREEN:
                hw = 66;
                break;
            case GAMEOVER:
                hw = 166;
                break;
            case VICTORY:
            default:
                hw = 52;
                break;
        }
        float hh = height / 2 - 12;
        glm::vec4 pink = PINK;
        pink.a = 0.5;
        glm::vec4 cyan = CYAN;
        cyan.a = 0.5;
        if (glitchTimer.getElapsedTimeInMillis(millis()) > glitchDuration) {
            if (glitch) {
                glitchDuration = int(piksel::Rng::getInstance().random(300, 1500));
            } else {
                glitchDuration = int(piksel::Rng::getInstance().random(150, 300));
            }
            glitchTimer.reset(millis());
            glitch = !glitch;
        }
        if (glitch) {
            g.scale(piksel::Rng::getInstance().random(0.99f, 1.01f), piksel::Rng::getInstance().random(0.99f, 1.01f));
        }
        g.translate(hw + (glitch ? piksel::Rng::getInstance().random(-3.0f, 3.0f) : 0), hh);
        std::string str;
        switch(state) {
            case STARTSCREEN:
                str = "Mario breaks out";
                break;
            case GAMEOVER:
                str = "GAME OVER";
                break;
            case VICTORY:
            default:
                str = "CONGRATULATIONS!";
                break;
        }
        g.fill(BLACK);
        g.text(str, 0, 3);
        if (glitch) {
            g.fill(pink);
            g.text(str, -3, 0);
            g.fill(cyan);
            g.text(str, 3, 0);
        }
        g.fill(WHITE);
        g.text(str, 0, 0);
        g.pop();
        if ((g.millis() / 1000) % 2 == 0) {
            g.text(state == STARTSCREEN ? "PRESS ENTER TO START" : "PRESS ENTER TO RESTART", width / 2 - (state == STARTSCREEN ? 95 : 105), height / 2 + 42);
        }
    }
}